

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

int run_test_metrics_idle_time_thread(void)

{
  int iVar1;
  long lVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t threads [5];
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x28) {
      for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 8) {
        uv_thread_join((long)threads + lVar2);
      }
      return 0;
    }
    iVar1 = uv_thread_create((long)threads + lVar2,metrics_routine_cb,0);
    if ((long)iVar1 != 0) break;
    lVar2 = lVar2 + 8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-metrics.c"
          ,0x66,"0","==","uv_thread_create(&threads[i], metrics_routine_cb, ((void*)0))",0,"==",
          (long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(metrics_idle_time_thread) {
  uv_thread_t threads[5];
  int i;

  for (i = 0; i < 5; i++) {
    ASSERT_EQ(0, uv_thread_create(&threads[i], metrics_routine_cb, NULL));
  }

  for (i = 0; i < 5; i++) {
    uv_thread_join(&threads[i]);
  }

  return 0;
}